

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

size_t __thiscall PStruct::PropagateMark(PStruct *this)

{
  uint uVar1;
  size_t sVar2;
  
  GC::MarkArray<PField*>(&this->Fields);
  uVar1 = (this->Fields).Count;
  sVar2 = PType::PropagateMark((PType *)this);
  return sVar2 + (ulong)uVar1 * 8;
}

Assistant:

size_t PStruct::PropagateMark()
{
	GC::MarkArray(Fields);
	return Fields.Size() * sizeof(void*) + Super::PropagateMark();
}